

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

int __thiscall luna::Lexer::GetToken(Lexer *this,TokenDetail *detail)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  TokenDetail *detail_00;
  undefined8 *in_RSI;
  Lexer *in_RDI;
  TokenDetail *in_stack_00000030;
  Lexer *in_stack_00000038;
  int next_2;
  int pre_next;
  int next_1;
  int token;
  int next;
  Lexer *in_stack_ffffffffffffff30;
  anon_class_1_0_00000001 *in_stack_ffffffffffffff38;
  TokenDetail *in_stack_ffffffffffffff40;
  function<bool_(int)> *this_00;
  Lexer *in_stack_ffffffffffffff48;
  TokenDetail *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  function<bool_(int)> *in_stack_ffffffffffffff80;
  function<bool_(int)> *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  TokenDetail *in_stack_ffffffffffffff98;
  Lexer *in_stack_ffffffffffffffa0;
  
  if (in_RSI == (undefined8 *)0x0) {
    __assert_fail("detail",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Lex.cpp",
                  0x55,"int luna::Lexer::GetToken(TokenDetail *)");
  }
  *in_RSI = 0;
  *(undefined4 *)(in_RSI + 3) = 0x11e;
  *(int *)(in_RSI + 2) = in_RDI->line_;
  *(int *)((long)in_RSI + 0x14) = in_RDI->column_;
  in_RSI[1] = in_RDI->module_;
  if (in_RDI->current_ == -1) {
    iVar1 = Next(in_stack_ffffffffffffff30);
    in_RDI->current_ = iVar1;
  }
  do {
    if (in_RDI->current_ == -1) {
      return 0x11e;
    }
    detail_00 = (TokenDetail *)(ulong)(in_RDI->current_ - 9);
    iVar1 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    switch(detail_00) {
    case (TokenDetail *)0x0:
    case (TokenDetail *)0x2:
    case (TokenDetail *)0x3:
    case (TokenDetail *)0x17:
      iVar1 = Next(in_stack_ffffffffffffff30);
      in_RDI->current_ = iVar1;
      break;
    case (TokenDetail *)0x1:
    case (TokenDetail *)0x4:
      LexNewLine(in_stack_ffffffffffffff30);
      break;
    default:
      iVar1 = LexId((Lexer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                    in_stack_ffffffffffffff58);
      return iVar1;
    case (TokenDetail *)0x19:
    case (TokenDetail *)0x1e:
      iVar1 = LexSingleLineString(in_RDI,detail_00);
      return iVar1;
    case (TokenDetail *)0x1a:
    case (TokenDetail *)0x1c:
    case (TokenDetail *)0x1f:
    case (TokenDetail *)0x20:
    case (TokenDetail *)0x21:
    case (TokenDetail *)0x22:
    case (TokenDetail *)0x23:
    case (TokenDetail *)0x26:
    case (TokenDetail *)0x31:
    case (TokenDetail *)0x32:
    case (TokenDetail *)0x54:
    case (TokenDetail *)0x55:
    case (TokenDetail *)0x72:
    case (TokenDetail *)0x74:
      iVar1 = in_RDI->current_;
      iVar2 = Next(in_stack_ffffffffffffff30);
      in_RDI->current_ = iVar2;
      *(int *)(in_RSI + 3) = iVar1;
      *(int *)(in_RSI + 2) = in_RDI->line_;
      *(int *)((long)in_RSI + 0x14) = in_RDI->column_;
      in_RSI[1] = in_RDI->module_;
      return iVar1;
    case (TokenDetail *)0x24:
      iVar1 = Next(in_stack_ffffffffffffff30);
      if (iVar1 != 0x2d) {
        in_RDI->current_ = iVar1;
        *(undefined4 *)(in_RSI + 3) = 0x2d;
        *(int *)(in_RSI + 2) = in_RDI->line_;
        *(int *)((long)in_RSI + 0x14) = in_RDI->column_;
        in_RSI[1] = in_RDI->module_;
        return 0x2d;
      }
      LexComment(in_stack_ffffffffffffff30);
      break;
    case (TokenDetail *)0x25:
      iVar1 = Next(in_stack_ffffffffffffff30);
      if (iVar1 != 0x2e) {
        iVar2 = isdigit(iVar1);
        if (iVar2 != 0) {
          this_00 = (function<bool_(int)> *)&in_RDI->token_buffer_;
          std::__cxx11::string::clear();
          std::__cxx11::string::push_back((char)this_00);
          in_RDI->current_ = iVar1;
          std::function<bool(int)>::function<luna::Lexer::GetToken(luna::TokenDetail*)::__0,void>
                    (this_00,in_stack_ffffffffffffff38);
          std::function<bool(int)>::function<luna::Lexer::GetToken(luna::TokenDetail*)::__1,void>
                    (this_00,in_stack_ffffffffffffff38);
          iVar1 = LexNumberXFractional
                            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                             (bool)in_stack_ffffffffffffff97,(bool)in_stack_ffffffffffffff96,
                             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          std::function<bool_(int)>::~function((function<bool_(int)> *)0x1ba7e3);
          std::function<bool_(int)>::~function((function<bool_(int)> *)0x1ba7f0);
          return iVar1;
        }
        in_RDI->current_ = iVar1;
        *(undefined4 *)(in_RSI + 3) = 0x2e;
        *(int *)(in_RSI + 2) = in_RDI->line_;
        *(int *)((long)in_RSI + 0x14) = in_RDI->column_;
        in_RSI[1] = in_RDI->module_;
        return 0x2e;
      }
      iVar1 = Next(in_stack_ffffffffffffff30);
      if (iVar1 == 0x2e) {
        iVar1 = Next(in_stack_ffffffffffffff30);
        in_RDI->current_ = iVar1;
        *(undefined4 *)(in_RSI + 3) = 0x11d;
        *(int *)(in_RSI + 2) = in_RDI->line_;
        *(int *)((long)in_RSI + 0x14) = in_RDI->column_;
        in_RSI[1] = in_RDI->module_;
        return 0x11d;
      }
      in_RDI->current_ = iVar1;
      *(undefined4 *)(in_RSI + 3) = 0x11c;
      *(int *)(in_RSI + 2) = in_RDI->line_;
      *(int *)((long)in_RSI + 0x14) = in_RDI->column_;
      in_RSI[1] = in_RDI->module_;
      return 0x11c;
    case (TokenDetail *)0x27:
    case (TokenDetail *)0x28:
    case (TokenDetail *)0x29:
    case (TokenDetail *)0x2a:
    case (TokenDetail *)0x2b:
    case (TokenDetail *)0x2c:
    case (TokenDetail *)0x2d:
    case (TokenDetail *)0x2e:
    case (TokenDetail *)0x2f:
    case (TokenDetail *)0x30:
      iVar1 = LexNumber(in_stack_00000038,in_stack_00000030);
      return iVar1;
    case (TokenDetail *)0x33:
      iVar1 = LexXEqual(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,iVar1);
      return iVar1;
    case (TokenDetail *)0x34:
      iVar1 = LexXEqual(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,iVar1);
      return iVar1;
    case (TokenDetail *)0x35:
      iVar1 = LexXEqual(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,iVar1);
      return iVar1;
    case (TokenDetail *)0x52:
      iVar1 = Next(in_stack_ffffffffffffff30);
      in_RDI->current_ = iVar1;
      if ((in_RDI->current_ != 0x5b) && (in_RDI->current_ != 0x3d)) {
        *(undefined4 *)(in_RSI + 3) = 0x5b;
        *(int *)(in_RSI + 2) = in_RDI->line_;
        *(int *)((long)in_RSI + 0x14) = in_RDI->column_;
        in_RSI[1] = in_RDI->module_;
        return 0x5b;
      }
      iVar1 = LexMultiLineString(in_RDI,detail_00);
      return iVar1;
    case (TokenDetail *)0x75:
      iVar1 = Next(in_stack_ffffffffffffff30);
      if (iVar1 == 0x3d) {
        iVar1 = Next(in_stack_ffffffffffffff30);
        in_RDI->current_ = iVar1;
        *(undefined4 *)(in_RSI + 3) = 0x119;
        *(int *)(in_RSI + 2) = in_RDI->line_;
        *(int *)((long)in_RSI + 0x14) = in_RDI->column_;
        in_RSI[1] = in_RDI->module_;
        return 0x119;
      }
      uVar3 = __cxa_allocate_exception(0x20);
      String::GetCStr(in_RDI->module_);
      LexException::LexException<char_const(&)[21]>
                ((LexException *)in_RDI,(char *)detail_00,in_stack_ffffffffffffff64,
                 in_stack_ffffffffffffff60,(char (*) [21])in_stack_ffffffffffffff58);
      __cxa_throw(uVar3,&LexException::typeinfo,LexException::~LexException);
    }
  } while( true );
}

Assistant:

int Lexer::GetToken(TokenDetail *detail)
    {
        assert(detail);
        SET_EOF_TOKEN_DETAIL(detail);
        if (current_ == EOF)
            current_ = Next();

        while (current_ != EOF)
        {
            switch (current_) {
            case ' ': case '\t': case '\v': case '\f':
                current_ = Next();
                break;
            case '\r': case '\n':
                LexNewLine();
                break;
            case '-':
                {
                    int next = Next();
                    if (next == '-')
                        LexComment();
                    else
                    {
                        current_ = next;
                        RETURN_NORMAL_TOKEN_DETAIL(detail, '-');
                    }
                }
                break;
            case '0': case '1': case '2': case '3': case '4':
            case '5': case '6': case '7': case '8': case '9':
                return LexNumber(detail);
            case '+': case '*': case '/': case '%': case '^':
            case '#': case '(': case ')': case '{': case '}':
            case ']': case ';': case ':': case ',':
                {
                    int token = current_;
                    current_ = Next();
                    RETURN_NORMAL_TOKEN_DETAIL(detail, token);
                }
                break;
            case '.':
                {
                    int next = Next();
                    if (next == '.')
                    {
                        int pre_next = Next();
                        if (pre_next == '.')
                        {
                            current_ = Next();
                            RETURN_NORMAL_TOKEN_DETAIL(detail, Token_VarArg);
                        }
                        else
                        {
                            current_ = pre_next;
                            RETURN_NORMAL_TOKEN_DETAIL(detail, Token_Concat);
                        }
                    }
                    else if (isdigit(next))
                    {
                        token_buffer_.clear();
                        token_buffer_.push_back(current_);
                        current_ = next;
                        return LexNumberXFractional(detail, false, true,
                                                    [](int c) { return isdigit(c) != 0; },
                                                    [](int c) { return c == 'e' || c == 'E'; });
                    }
                    else
                    {
                        current_ = next;
                        RETURN_NORMAL_TOKEN_DETAIL(detail, '.');
                    }
                }
                break;
            case '~':
                {
                    int next = Next();
                    if (next != '=')
                        throw LexException(module_->GetCStr(),
                                line_, column_, "expect '=' after '~'");
                    current_ = Next();
                    RETURN_NORMAL_TOKEN_DETAIL(detail, Token_NotEqual);
                }
                break;
            case '=':
                return LexXEqual(detail, Token_Equal);
            case '>':
                return LexXEqual(detail, Token_GreaterEqual);
            case '<':
                return LexXEqual(detail, Token_LessEqual);
            case '[':
                {
                    current_ = Next();
                    if (current_ == '[' || current_ == '=')
                        return LexMultiLineString(detail);
                    else
                        RETURN_NORMAL_TOKEN_DETAIL(detail, '[');
                }
                break;
            case '\'': case '"':
                return LexSingleLineString(detail);
            default:
                return LexId(detail);
            }
        }

        return Token_EOF;
    }